

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmSourceFile * __thiscall cmMakefile::LinearGetSourceFileWithOutput(cmMakefile *this,string *name)

{
  bool bVar1;
  reference ppcVar2;
  cmCustomCommand *pcVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference pbVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  size_type pos;
  string *output;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  cmSourceFile *src;
  const_iterator __end1;
  const_iterator __begin1;
  SourceFileVec *__range1;
  string out;
  string *name_local;
  cmMakefile *this_local;
  
  out.field_2._8_8_ = name;
  std::__cxx11::string::string((string *)&__range1);
  __end1 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin(&this->SourceFiles);
  src = (cmSourceFile *)
        std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end(&this->SourceFiles);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                     *)&src), bVar1) {
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
              ::operator*(&__end1);
    this_local = (cmMakefile *)*ppcVar2;
    pcVar3 = cmSourceFile::GetCustomCommand((cmSourceFile *)this_local);
    if (pcVar3 != (cmCustomCommand *)0x0) {
      pcVar3 = cmSourceFile::GetCustomCommand((cmSourceFile *)this_local);
      this_00 = cmCustomCommand::GetOutputs_abi_cxx11_(pcVar3);
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_00);
      output = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&output), bVar1) {
        pbVar4 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end3);
        std::__cxx11::string::operator=((string *)&__range1,(string *)pbVar4);
        lVar5 = std::__cxx11::string::rfind((string *)&__range1,out.field_2._8_8_);
        if (lVar5 != -1) {
          lVar6 = std::__cxx11::string::size();
          lVar7 = std::__cxx11::string::size();
          if ((lVar5 == lVar6 - lVar7) &&
             ((lVar5 == 0 ||
              (pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&__range1), *pcVar8 == '/'))
             )) goto LAB_004874ea;
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
    }
    __gnu_cxx::
    __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
    ::operator++(&__end1);
  }
  this_local = (cmMakefile *)0x0;
LAB_004874ea:
  std::__cxx11::string::~string((string *)&__range1);
  return (cmSourceFile *)this_local;
}

Assistant:

cmSourceFile* cmMakefile::LinearGetSourceFileWithOutput(
  const std::string& name) const
{
  std::string out;

  // look through all the source files that have custom commands
  // and see if the custom command has the passed source file as an output
  for (cmSourceFile* src : this->SourceFiles) {
    // does this source file have a custom command?
    if (src->GetCustomCommand()) {
      // Does the output of the custom command match the source file name?
      const std::vector<std::string>& outputs =
        src->GetCustomCommand()->GetOutputs();
      for (std::string const& output : outputs) {
        out = output;
        std::string::size_type pos = out.rfind(name);
        // If the output matches exactly
        if (pos != std::string::npos && pos == out.size() - name.size() &&
            (pos == 0 || out[pos - 1] == '/')) {
          return src;
        }
      }
    }
  }

  // otherwise return NULL
  return nullptr;
}